

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O0

void __thiscall xray_re::se_sim_faction::state_write(se_sim_faction *this,xr_packet *packet)

{
  xr_packet *packet_local;
  se_sim_faction *this_local;
  
  cse_alife_smart_zone::state_write(&this->super_cse_alife_smart_zone,packet);
  if ((this->super_cse_alife_smart_zone).super_cse_alife_space_restrictor.
      super_cse_alife_dynamic_object.super_cse_alife_object.super_cse_abstract.m_version < 0x7a) {
    if (((this->super_cse_alife_smart_zone).super_cse_alife_space_restrictor.
         super_cse_alife_dynamic_object.super_cse_alife_object.super_cse_abstract.m_version != 0x76)
       && ((this->super_cse_alife_smart_zone).super_cse_alife_space_restrictor.
           super_cse_alife_dynamic_object.super_cse_alife_object.super_cse_abstract.m_version !=
           0x65)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x279,"virtual void xray_re::se_sim_faction::state_write(xr_packet &)");
    }
  }
  else {
    if (0x7c < (this->super_cse_alife_smart_zone).super_cse_alife_space_restrictor.
               super_cse_alife_dynamic_object.super_cse_alife_object.super_cse_abstract.m_version) {
      __assert_fail("m_version <= CSE_VERSION_CS",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x269,"virtual void xray_re::se_sim_faction::state_write(xr_packet &)");
    }
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_SAVE,false,"se_sim_faction");
    (*packet->_vptr_xr_packet[0xc])(packet,0);
    (*packet->_vptr_xr_packet[0xc])(packet,0);
    (*packet->_vptr_xr_packet[10])(packet,0);
    w_ctime(packet,true);
    (*packet->_vptr_xr_packet[10])(packet,0);
    (*packet->_vptr_xr_packet[10])(packet,0);
    (*packet->_vptr_xr_packet[10])(packet,0);
    (*packet->_vptr_xr_packet[8])(packet,0);
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_SAVE,true,"se_sim_faction");
  }
  return;
}

Assistant:

void se_sim_faction::state_write(xr_packet& packet)
{
	cse_alife_smart_zone::state_write(packet);
	if (m_version >= CSE_VERSION_0x7a) {
		xr_assert(m_version <= CSE_VERSION_CS);
		set_save_marker(packet, SM_SAVE, false, "se_sim_faction");
		packet.w_bool(false);
		packet.w_bool(false);
		packet.w_u8(0);
		w_ctime(packet, true);
		packet.w_u8(0);
		packet.w_u8(0);
		packet.w_u8(0);
		packet.w_u16(0);
		set_save_marker(packet, SM_SAVE, true, "se_sim_faction");
	} else if (m_version == CSE_VERSION_SOC) {
		// stub
	} else if (m_version == CSE_VERSION_2215) {
		// stub for aiwrapper, see se_respawn and aiwrapper.ini
	} else {
		xr_not_implemented();
	}
}